

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticdecoder.cpp
# Opt level: O2

U8 __thiscall ArithmeticDecoder::readByte(ArithmeticDecoder *this)

{
  ulong uVar1;
  undefined4 *puVar2;
  uint uVar3;
  
  uVar3 = this->length >> 8;
  this->length = uVar3;
  uVar1 = (ulong)this->value / (ulong)uVar3;
  this->value = this->value % uVar3;
  renorm_dec_interval(this);
  if ((uint)uVar1 < 0x100) {
    return (U8)uVar1;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0x1267;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

U8 ArithmeticDecoder::readByte()
{
  U32 sym = value / (length >>= 8);            // decode symbol, change length
  value -= length * sym;                                    // update interval

  if (length < AC__MinLength) renorm_dec_interval();        // renormalization

  if (sym >= (1u<<8))
  {
    throw 4711;
  }

  return (U8)sym;
}